

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::WordBoundaryNode::AnnotatePass1
          (WordBoundaryNode *this,Compiler *compiler,bool parentNotInLoop,bool parentAtLeastOnce,
          bool parentNotSpeculative,bool parentNotNegated)

{
  CharSet<char16_t> *pCVar1;
  bool parentNotNegated_local;
  bool parentNotSpeculative_local;
  bool parentAtLeastOnce_local;
  bool parentNotInLoop_local;
  Compiler *compiler_local;
  WordBoundaryNode *this_local;
  
  (this->super_Node).features = 8;
  CountDomain::Exact(&(this->super_Node).thisConsumes,0);
  *(uint *)&(this->super_Node).field_0xc = *(uint *)&(this->super_Node).field_0xc & 0xfffffffe;
  *(uint *)&(this->super_Node).field_0xc = *(uint *)&(this->super_Node).field_0xc & 0xfffffffd;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xffffffef | 0x10;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xffffffdf | 0x20;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xfffffbff | (uint)parentNotInLoop << 10;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xfffff7ff | (uint)parentAtLeastOnce << 0xb;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xffffefff | (uint)parentNotSpeculative << 0xc;
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xffffdfff | (uint)parentNotNegated << 0xd;
  if ((this->isNegation & 1U) == 0) {
    if (((this->mustIncludeEntering & 1U) == 0) || ((this->mustIncludeLeaving & 1U) != 0)) {
      if (((this->mustIncludeLeaving & 1U) == 0) || ((this->mustIncludeEntering & 1U) != 0)) {
        pCVar1 = StandardChars<char16_t>::GetFullSet(compiler->standardChars);
        (this->super_Node).firstSet = pCVar1;
      }
      else {
        pCVar1 = StandardChars<char16_t>::GetNonWordSet(compiler->standardChars);
        (this->super_Node).firstSet = pCVar1;
      }
    }
    else {
      pCVar1 = StandardChars<char16_t>::GetWordSet(compiler->standardChars);
      (this->super_Node).firstSet = pCVar1;
    }
  }
  else {
    pCVar1 = StandardChars<char16_t>::GetFullSet(compiler->standardChars);
    (this->super_Node).firstSet = pCVar1;
  }
  return;
}

Assistant:

void WordBoundaryNode::AnnotatePass1(Compiler& compiler, bool parentNotInLoop, bool parentAtLeastOnce, bool parentNotSpeculative, bool parentNotNegated)
    {
        features = HasWordBoundary;
        thisConsumes.Exact(0);
        isFirstExact = false;
        isThisIrrefutable = false;
        isThisWillNotProgress = true;
        isThisWillNotRegress = true;
        isNotInLoop = parentNotInLoop;
        isAtLeastOnce = parentAtLeastOnce;
        isNotSpeculative = parentNotSpeculative;
        isNotNegated = parentNotNegated;
        if (isNegation)
            firstSet = compiler.standardChars->GetFullSet();
        else
        {
            if (mustIncludeEntering && !mustIncludeLeaving)
                firstSet = compiler.standardChars->GetWordSet();
            else if (mustIncludeLeaving && !mustIncludeEntering)
                firstSet = compiler.standardChars->GetNonWordSet();
            else
                firstSet = compiler.standardChars->GetFullSet();
        }
    }